

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_mm_len(jit_State *J,TRef tr,TValue *tv)

{
  int iVar1;
  BCReg BVar2;
  jit_State *pjVar3;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  TValue *basev;
  TRef *base;
  BCReg func;
  RecordIndex ix;
  undefined8 in_stack_fffffffffffffef8;
  TraceError e;
  jit_State *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined8 local_d8 [5];
  uint32_t local_b0;
  undefined8 *local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  
  e = (TraceError)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  pjVar3 = (jit_State *)*in_RDX;
  local_a8 = in_RDX;
  local_9c = in_ESI;
  local_98 = in_RDI;
  iVar1 = lj_record_mm_lookup((jit_State *)"copy of dead GC object",*(RecordIndex **)(in_RDI + 0x68)
                              ,(MMS)((ulong)&stack0xffffffffffffff10 >> 0x20));
  if (iVar1 != 0) {
    BVar2 = rec_mm_prep(pjVar3,(ASMFunction)
                               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    pjVar3 = (jit_State *)(*(long *)(local_98 + 0x88) + (ulong)BVar2 * 4);
    local_70 = (undefined8 *)(*(long *)(*(long *)(local_98 + 0x68) + 0x10) + (ulong)BVar2 * 8);
    (pjVar3->cur).nextgc.gcptr32 = local_b0;
    local_68 = *(undefined8 *)(local_98 + 0x68);
    local_78 = local_d8;
    *local_70 = local_d8[0];
    (pjVar3->cur).marked = (undefined1)local_9c;
    (pjVar3->cur).gct = local_9c._1_1_;
    (pjVar3->cur).nsnap = local_9c._2_2_;
    local_80 = *(undefined8 *)(local_98 + 0x68);
    local_88 = local_70 + 1;
    local_90 = local_a8;
    *local_88 = *local_a8;
    (pjVar3->cur).nins = 0x7fff;
    *(undefined4 *)((long)local_70 + 0x14) = 0xffffffff;
    lj_record_call(pjVar3,(BCReg)((ulong)local_70 >> 0x20),0x1a203a);
    return 0;
  }
  lj_trace_err(in_stack_ffffffffffffff00,e);
}

Assistant:

static TRef rec_mm_len(jit_State *J, TRef tr, TValue *tv)
{
  RecordIndex ix;
  ix.tab = tr;
  copyTV(J->L, &ix.tabv, tv);
  if (lj_record_mm_lookup(J, &ix, MM_len)) {
    BCReg func = rec_mm_prep(J, lj_cont_ra);
    TRef *base = J->base + func;
    TValue *basev = J->L->base + func;
    base[0] = ix.mobj; copyTV(J->L, basev+0, &ix.mobjv);
    base += LJ_FR2;
    basev += LJ_FR2;
    base[1] = tr; copyTV(J->L, basev+1, tv);
#if LJ_52
    base[2] = tr; copyTV(J->L, basev+2, tv);
#else
    base[2] = TREF_NIL; setnilV(basev+2);
#endif
    lj_record_call(J, func, 2);
  } else {
    if (LJ_52 && tref_istab(tr))
      return lj_ir_call(J, IRCALL_lj_tab_len, tr);
    lj_trace_err(J, LJ_TRERR_NOMM);
  }
  return 0;  /* No result yet. */
}